

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

String * __thiscall Path::readAll(String *__return_storage_ptr__,Path *this,size_t max)

{
  FILE *__stream;
  
  __stream = fopen((this->super_String).mString._M_dataplus._M_p,"r");
  if (__stream == (FILE *)0x0) {
    (__return_storage_ptr__->mString)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mString).field_2;
    (__return_storage_ptr__->mString)._M_string_length = 0;
    (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
  }
  else {
    Rct::readAll(__return_storage_ptr__,(FILE *)__stream,(int)max);
    fclose(__stream);
  }
  return __return_storage_ptr__;
}

Assistant:

String Path::readAll(size_t max) const
{
    FILE *f = fopen(constData(), "r");
    if (!f)
        return String();
    const String ret = Rct::readAll(f, max);
    fclose(f);
    return ret;
}